

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Append(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  Gia_Man_t *pTwo;
  char *pcVar4;
  int level;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (argc - globalUtilOptind == 1) {
      pcVar4 = argv[globalUtilOptind];
      pcVar3 = pcVar4;
      do {
        if (*pcVar3 == '>') {
          *pcVar3 = '\\';
        }
        else if (*pcVar3 == '\0') {
          __stream = fopen(pcVar4,"r");
          if (__stream == (FILE *)0x0) {
            Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar4);
            pcVar4 = Extra_FileGetSimilarName
                               (pcVar4,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
            if (pcVar4 != (char *)0x0) {
              Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
            }
            pcVar4 = "\n";
            iVar2 = 1;
            level = 1;
          }
          else {
            fclose(__stream);
            pTwo = Gia_AigerRead(pcVar4,0,0,0);
            if (pTwo != (Gia_Man_t *)0x0) {
              Gia_ManDupAppend(pAbc->pGia,pTwo);
              Gia_ManStop(pTwo);
              return 0;
            }
            pcVar4 = "Reading AIGER has failed.\n";
            iVar2 = 0;
            level = -1;
          }
          Abc_Print(level,pcVar4);
          return iVar2;
        }
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
    pcVar4 = "File name is not given on the command line.\n";
    iVar2 = -1;
  }
  else {
    Abc_Print(-2,"usage: &append [-vh] <file>\n");
    Abc_Print(-2,"\t         appends <file> to the current AIG using new PIs and POs\n");
    pcVar4 = "yes";
    if (!bVar1) {
      pcVar4 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar4 = "\t<file> : AIGER file with the design to miter\n";
    iVar2 = -2;
  }
  Abc_Print(iVar2,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Append( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    Gia_ManDupAppend( pAbc->pGia, pSecond );
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &append [-vh] <file>\n" );
    Abc_Print( -2, "\t         appends <file> to the current AIG using new PIs and POs\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the design to miter\n");
    return 1;
}